

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void google::protobuf::PlanAllocationSize
               (RepeatedPtrField<google::protobuf::OneofDescriptorProto> *oneofs,
               size_t parent_scope_size,FlatAllocator *alloc)

{
  bool bVar1;
  int array_size;
  reference this;
  long lVar2;
  size_t local_58;
  OneofDescriptorProto *oneof;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *__range2;
  FlatAllocator *alloc_local;
  size_t parent_scope_size_local;
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *oneofs_local;
  
  array_size = RepeatedPtrField<google::protobuf::OneofDescriptorProto>::size(oneofs);
  anon_unknown_24::
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  ::PlanArray<google::protobuf::OneofDescriptor>
            (&alloc->
              super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
             ,array_size);
  __end2 = RepeatedPtrField<google::protobuf::OneofDescriptorProto>::begin(oneofs);
  oneof = (OneofDescriptorProto *)
          RepeatedPtrField<google::protobuf::OneofDescriptorProto>::end(oneofs);
  while (bVar1 = internal::operator!=(&__end2,(iterator *)&oneof), bVar1) {
    this = internal::RepeatedPtrIterator<const_google::protobuf::OneofDescriptorProto>::operator*
                     (&__end2);
    if (parent_scope_size == 0) {
      OneofDescriptorProto::name_abi_cxx11_(this);
      local_58 = std::__cxx11::string::size();
    }
    else {
      OneofDescriptorProto::name_abi_cxx11_(this);
      lVar2 = std::__cxx11::string::size();
      local_58 = parent_scope_size + 1 + lVar2;
    }
    anon_unknown_24::
    FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
    ::PlanEntityNames(&alloc->
                       super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                      ,local_58);
    bVar1 = OneofDescriptorProto::has_options(this);
    if (bVar1) {
      anon_unknown_24::
      FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
      ::PlanArray<google::protobuf::OneofOptions>
                (&alloc->
                  super_FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
                 ,1);
    }
    internal::RepeatedPtrIterator<const_google::protobuf::OneofDescriptorProto>::operator++(&__end2)
    ;
  }
  return;
}

Assistant:

static void PlanAllocationSize(
    const RepeatedPtrField<OneofDescriptorProto>& oneofs,
    size_t parent_scope_size, internal::FlatAllocator& alloc) {
  alloc.PlanArray<OneofDescriptor>(oneofs.size());
  for (const auto& oneof : oneofs) {
    alloc.PlanEntityNames(parent_scope_size
                              ? parent_scope_size + 1 + oneof.name().size()
                              : oneof.name().size());
    if (oneof.has_options()) alloc.PlanArray<OneofOptions>(1);
  }
}